

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O3

int __thiscall
TPZBlockDiagonal<long_double>::PutVal
          (TPZBlockDiagonal<long_double> *this,int64_t row,int64_t col,longdouble *value)

{
  longdouble lVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar3 = (this->fBlockSize).fNElements;
  if (lVar3 == 0) {
    pcVar4 = "TPZBlockDiagonal::PutVal called with parameters out of range\n";
    lVar3 = 0x3d;
  }
  else {
    lVar2 = 0;
    lVar8 = 0;
    do {
      lVar7 = lVar8;
      lVar6 = lVar2;
      lVar5 = (long)(this->fBlockSize).fStore[lVar6];
      lVar8 = lVar7 + lVar5;
      if (lVar3 <= lVar6) break;
      lVar2 = lVar6 + 1;
    } while (lVar8 <= row);
    if (lVar3 + 1 != lVar6 + 1) {
      lVar1 = *value;
      if (col < lVar7 || lVar8 <= col) {
        if ((lVar1 != (longdouble)0) || (NAN(lVar1) || NAN((longdouble)0))) {
          pcVar4 = "TPZBlockDiagonal::PutVal, indices row col out of range\n";
          lVar3 = 0x37;
          goto LAB_00bb9b6e;
        }
      }
      else {
        (this->fStorage).fStore
        [(row - lVar7) + (this->fBlockPos).fStore[lVar6] + (col - lVar7) * lVar5] = lVar1;
      }
      return 0;
    }
    pcVar4 = "TPZBlockDiagonal::PutVal wrong data structure\n";
    lVar3 = 0x2e;
  }
LAB_00bb9b6e:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,lVar3);
  return -1;
}

Assistant:

TPZBlockDiagonal<TVar>::~TPZBlockDiagonal ()
{
}